

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap.c
# Opt level: O2

void spell_word_of_command(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  CHAR_DATA *ch_00;
  size_t sVar4;
  char *pcVar5;
  char arg2 [4608];
  char buf [4608];
  char arg1 [4608];
  
  target_name = one_argument(target_name,arg1);
  target_name = one_argument(target_name,arg2);
  if (((arg1[0] == '\0') || (arg2[0] == '\0')) || (*target_name == '\0')) {
    ch->wait = 0;
    ch->mana = ch->mana + 0x96;
    pcVar5 = "Syntax: cast \'word of command\' <target> <command phrase> <action>\n\r";
  }
  else {
    ch_00 = get_char_room(ch,arg1);
    if (ch_00 == (CHAR_DATA *)0x0) {
      ch->wait = 0;
      ch->mana = ch->mana + 0x96;
      pcVar5 = "They aren\'t here.\n\r";
    }
    else if (ch_00 == ch) {
      pcVar5 = "As persuasive as you are, you\'re unable to corrupt your own mind.\n\r";
    }
    else {
      bVar1 = is_immortal(ch_00);
      if ((!bVar1) || (bVar1 = is_immortal(ch), bVar1)) {
        bVar1 = is_safe_new(ch,ch_00,true);
        if (bVar1) {
          return;
        }
        bVar1 = is_npc(ch_00);
        if (bVar1) {
          pcVar5 = "You cannot manipulate such a being\'s mind.\n\r";
        }
        else {
          bVar1 = is_affected(ch,(int)gsn_word_of_command);
          if (!bVar1) {
            bVar1 = is_immortal(ch_00);
            if (bVar1) {
              iVar2 = get_trust(ch);
              iVar3 = get_trust(ch_00);
              if (iVar2 < iVar3) {
                pcVar5 = "Don\'t do that.  No, really.  Don\'t.\n\r";
                goto LAB_0037fc67;
              }
            }
            bVar1 = str_prefix(target_name,"delete");
            if (((bVar1) && (bVar1 = str_prefix(target_name,"quit"), bVar1)) &&
               ((bVar1 = str_prefix(target_name,"pass"), bVar1 &&
                (bVar1 = str_prefix(target_name,"pray"), bVar1)))) {
              iVar2 = get_curr_stat(ch_00,1);
              bVar1 = saves_spell((level - iVar2) + 0x14,ch_00,0x11);
              if (bVar1) {
                act("$N\'s mind resists your word of command.",ch,(void *)0x0,ch_00,3);
                act("You fend off a dark mental assault by $n!",ch,(void *)0x0,ch_00,2);
                sprintf(buf,"Die, %s you sorcerous dog!",ch->name);
                do_myell(ch_00,buf,ch);
                multi_hit(ch_00,ch,-1);
                return;
              }
              act("You successfully implant a word of command in $N\'s malleable mind.",ch,
                  (void *)0x0,ch_00,3);
              sVar4 = strlen(arg2);
              arg2[sVar4] = '\0';
              pcVar5 = palloc_string(arg2);
              ch_00->pcdata->command[0] = pcVar5;
              pcVar5 = palloc_string(target_name);
              ch_00->pcdata->command[1] = pcVar5;
              init_affect((AFFECT_DATA *)buf);
              buf[0x1a] = '\0';
              buf[0x1b] = '\0';
              buf[0x38] = '\x05';
              buf[0x39] = '\0';
              buf[0x3a] = '\0';
              buf[0x3b] = '\0';
              buf[0x1c] = (undefined1)gsn_word_of_command;
              buf[0x1d] = gsn_word_of_command._1_1_;
              buf[0x20] = -1;
              buf[0x21] = -1;
              buf[0x22] = '\0';
              buf[0x23] = '\0';
              buf[0x24] = '\0';
              buf[0x25] = '\0';
              buf[0x40] = '\0';
              buf[0x41] = '\0';
              buf[0x42] = '\0';
              buf[0x43] = '\0';
              buf[0x44] = '\0';
              buf[0x45] = '\0';
              buf[0x46] = '\0';
              buf[0x47] = '\0';
              buf[0x50] = '\0';
              buf[0x51] = '\0';
              buf[0x52] = '\0';
              buf[0x53] = '\0';
              buf[0x54] = '\0';
              buf[0x55] = '\0';
              buf[0x56] = '\0';
              buf[0x57] = '\0';
              buf._8_8_ = ch;
              buf._30_2_ = (short)level;
              affect_to_char(ch_00,(AFFECT_DATA *)buf);
              return;
            }
            send_to_char("What the hell do you think you\'re doing?\n\r",ch);
            act("A bolt from the heavens smites you!",ch,(void *)0x0,(void *)0x0,3);
            act("A bolt from the heavens smites $n!",ch,(void *)0x0,(void *)0x0,0);
            ch->hit = ch->hit / 2;
            return;
          }
          pcVar5 = "They already have a word of command implanted in their mind.\n\r";
        }
      }
      else {
        pcVar5 = "Don\'t even think about it.\n\r";
      }
    }
  }
LAB_0037fc67:
  send_to_char(pcVar5,ch);
  return;
}

Assistant:

void spell_word_of_command(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	char arg1[MSL], arg2[MSL], buf[MSL];
	AFFECT_DATA af;
	CHAR_DATA *victim;

	target_name = one_argument(target_name, arg1);
	target_name = one_argument(target_name, arg2);

	if (arg1[0] == '\0' || arg2[0] == '\0' || target_name[0] == '\0')
	{
		ch->wait = 0;
		ch->mana += 150;

		send_to_char("Syntax: cast 'word of command' <target> <command phrase> <action>\n\r", ch);
		return;
	}

	if ((victim = get_char_room(ch, arg1)) == nullptr)
	{
		ch->wait = 0;
		ch->mana += 150;

		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (ch == victim)
	{
		send_to_char("As persuasive as you are, you're unable to corrupt your own mind.\n\r", ch);
		return;
	}

	if (is_immortal(victim) && !is_immortal(ch))
	{
		send_to_char("Don't even think about it.\n\r", ch);
		return;
	}

	if (is_safe_new(ch, victim, true))
		return;

	if (is_npc(victim))
	{
		send_to_char("You cannot manipulate such a being's mind.\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_word_of_command))
	{
		send_to_char("They already have a word of command implanted in their mind.\n\r", ch);
		return;
	}

	if (is_immortal(victim) && get_trust(ch) < get_trust(victim))
	{
		send_to_char("Don't do that.  No, really.  Don't.\n\r", ch);
		return;
	}

	if (!str_prefix(target_name, "delete")
		|| !str_prefix(target_name, "quit")
		|| !str_prefix(target_name, "pass")
		||
		!str_prefix(target_name, "pray"))
	{
		send_to_char("What the hell do you think you're doing?\n\r", ch);

		act("A bolt from the heavens smites you!", ch, 0, 0, TO_CHAR);
		act("A bolt from the heavens smites $n!", ch, 0, 0, TO_ROOM);

		ch->hit /= 2;
		return;
	}

	if (saves_spell(level + 20 - get_curr_stat(victim, STAT_INT), victim, DAM_CHARM))
	{
		act("$N's mind resists your word of command.", ch, 0, victim, TO_CHAR);
		act("You fend off a dark mental assault by $n!", ch, 0, victim, TO_VICT);

		sprintf(buf, "Die, %s you sorcerous dog!", ch->name);
		do_myell(victim, buf, ch);

		multi_hit(victim, ch, TYPE_UNDEFINED);
		return;
	}

	act("You successfully implant a word of command in $N's malleable mind.", ch, 0, victim, TO_CHAR);

	arg2[strlen(arg2)] = '\0';

	victim->pcdata->command[0] = palloc_string(arg2);
	victim->pcdata->command[1] = palloc_string(target_name);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_INVIS;
	af.type = gsn_word_of_command;
	af.owner = ch;
	af.level = level;
	af.location = 0;
	af.duration = -1;
	af.modifier = 0;
	af.tick_fun = 0;
	af.end_fun = 0;
	affect_to_char(victim, &af);
}